

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

uint32_t gnu_hash(char *s)

{
  uint32_t local_1c;
  byte *pbStack_18;
  uint32_t h;
  uint8_t *name;
  char *s_local;
  
  local_1c = 0x1505;
  for (pbStack_18 = (byte *)s; *pbStack_18 != 0; pbStack_18 = pbStack_18 + 1) {
    local_1c = local_1c * 0x21 + (uint)*pbStack_18;
  }
  return local_1c;
}

Assistant:

static uint32_t gnu_hash(const char *s)
{
    const uint8_t *name = (const uint8_t *)s;
    uint32_t h = 5381;
    while (*name)
        h = (h << 5) + h + *name++;
    return h;
}